

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFlattenLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  allocator local_129;
  undefined1 local_128 [32];
  Result local_108;
  undefined1 local_d8 [32];
  Result local_b8;
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_88,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  pNVar1 = local_20;
  if ((bVar2) && ((this->ndArrayInterpretation & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,"Flatten",
               (allocator *)((long)local_108.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_d8 + 0x20),pNVar1,(string *)local_d8,&this->blobNameToRank)
    ;
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_d8 + 0x20));
    Result::~Result((Result *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_108.m_message._M_storage._M_storage + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    pNVar1 = local_20;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_128,"Flatten",&local_129);
      validateRankCount((Result_conflict *)(local_128 + 0x20),pNVar1,(string *)local_128,3,-1,
                        &this->blobNameToRank);
      Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_128 + 0x20));
      Result::~Result((Result *)(local_128 + 0x20));
      std::__cxx11::string::~string((string *)local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      Result::good((Result *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFlattenLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Flatten", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Flatten", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    return r;
}